

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  char *__s;
  allocator<char> local_171;
  string local_170;
  uint local_150;
  BinaryenIndex i;
  undefined1 local_140 [8];
  PassRunner passRunner;
  BinaryenIndex numPasses_local;
  char **passes_local;
  BinaryenModuleRef module_local;
  BinaryenFunctionRef func_local;
  
  passRunner.skippedPasses._M_h._M_single_bucket._4_4_ = numPasses;
  wasm::PassRunner::PassRunner((PassRunner *)local_140,module);
  wasm::PassOptions::operator=
            ((PassOptions *)
             &passRunner.passes.
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&globalPassOptions);
  for (local_150 = 0; local_150 < passRunner.skippedPasses._M_h._M_single_bucket._4_4_;
      local_150 = local_150 + 1) {
    __s = passes[local_150];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__s,&local_171);
    wasm::PassRunner::add((PassRunner *)local_140,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_140,func);
  wasm::PassRunner::~PassRunner((PassRunner *)local_140);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i]);
  }
  passRunner.runOnFunction((Function*)func);
}